

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_rem_i32_m68k(TCGContext_conflict2 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2)

{
  TCGTemp *ts;
  TCGOp *pTVar1;
  uintptr_t o_2;
  uintptr_t o;
  uintptr_t o_1;
  
  ts = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_sari_i32_m68k(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),arg1,0x1f);
  pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_div2_i32);
  pTVar1->args[0] = (TCGArg)ts;
  pTVar1->args[1] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar1->args[3] = (TCGArg)ts;
  pTVar1->args[4] = (TCGArg)(arg2 + (long)tcg_ctx);
  tcg_temp_free_internal_m68k(tcg_ctx,ts);
  return;
}

Assistant:

void tcg_gen_rem_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2)
{
    if (TCG_TARGET_HAS_rem_i32) {
        tcg_gen_op3_i32(tcg_ctx, INDEX_op_rem_i32, ret, arg1, arg2);
    } else if (TCG_TARGET_HAS_div_i32) {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_op3_i32(tcg_ctx, INDEX_op_div_i32, t0, arg1, arg2);
        tcg_gen_mul_i32(tcg_ctx, t0, t0, arg2);
        tcg_gen_sub_i32(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    } else if (TCG_TARGET_HAS_div2_i32) {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_sari_i32(tcg_ctx, t0, arg1, 31);
        tcg_gen_op5_i32(tcg_ctx, INDEX_op_div2_i32, t0, ret, arg1, t0, arg2);
        tcg_temp_free_i32(tcg_ctx, t0);
    } else {
        gen_helper_rem_i32(tcg_ctx, ret, arg1, arg2);
    }
}